

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall
wabt::SharedValidator::OnStructType
          (SharedValidator *this,Location *param_1,Index field_count,TypeMut *fields)

{
  allocator<wabt::TypeMut> local_69;
  TypeMutVector local_68;
  StructType local_50;
  Index local_34;
  TypeMut *local_30;
  TypeMut *fields_local;
  Location *pLStack_20;
  Index field_count_local;
  Location *param_1_local;
  SharedValidator *this_local;
  
  local_34 = this->num_types_;
  this->num_types_ = local_34 + 1;
  local_30 = fields;
  fields_local._4_4_ = field_count;
  pLStack_20 = param_1;
  param_1_local = (Location *)this;
  std::allocator<wabt::TypeMut>::allocator(&local_69);
  std::vector<wabt::TypeMut,std::allocator<wabt::TypeMut>>::vector<wabt::TypeMut*,void>
            ((vector<wabt::TypeMut,std::allocator<wabt::TypeMut>> *)&local_68,fields,
             fields + field_count,&local_69);
  StructType::StructType(&local_50,&local_68);
  std::
  map<unsigned_int,wabt::SharedValidator::StructType,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,wabt::SharedValidator::StructType>>>
  ::emplace<unsigned_int,wabt::SharedValidator::StructType>
            ((map<unsigned_int,wabt::SharedValidator::StructType,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,wabt::SharedValidator::StructType>>>
              *)&this->struct_types_,&local_34,&local_50);
  StructType::~StructType(&local_50);
  std::vector<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>::~vector(&local_68);
  std::allocator<wabt::TypeMut>::~allocator(&local_69);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result SharedValidator::OnStructType(const Location&,
                                     Index field_count,
                                     TypeMut* fields) {
  struct_types_.emplace(num_types_++, StructType{TypeMutVector(
                                          &fields[0], &fields[field_count])});
  return Result::Ok;
}